

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  pointer *ppptVar1;
  long *plVar2;
  iterator __position;
  _typeobject *p_Var3;
  tuple_iterator tVar4;
  internals *piVar5;
  const_iterator cVar6;
  type_info **pptVar7;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  sequence_fast_readonly sVar8;
  ulong uVar9;
  long *plVar10;
  type_info *tinfo;
  value_type type;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  handle local_68;
  handle local_60;
  _typeobject **local_58;
  iterator iStack_50;
  _typeobject **local_48;
  _typeobject *local_38;
  
  local_58 = (_typeobject **)0x0;
  iStack_50._M_current = (_typeobject **)0x0;
  local_48 = (_typeobject **)0x0;
  local_60.m_ptr = t->tp_bases;
  if ((_typeobject *)local_60.m_ptr != (_typeobject *)0x0) {
    (((_typeobject *)local_60.m_ptr)->ob_base).ob_base.ob_refcnt =
         (((_typeobject *)local_60.m_ptr)->ob_base).ob_base.ob_refcnt + 1;
  }
  sVar8.ptr = (PyObject **)&((_typeobject *)local_60.m_ptr)->tp_name;
  if ((((((_typeobject *)local_60.m_ptr)->ob_base).ob_base.ob_type)->tp_flags & 0x2000000) != 0) {
    sVar8.ptr = (PyObject **)*sVar8.ptr;
  }
  tVar4 = tuple::end((tuple *)&local_60);
  if ((sequence_fast_readonly)sVar8.ptr != tVar4.super_sequence_fast_readonly.ptr) {
    do {
      local_68.m_ptr = *sVar8.ptr;
      if (iStack_50._M_current == local_48) {
        std::vector<_typeobject*,std::allocator<_typeobject*>>::_M_realloc_insert<_typeobject*>
                  ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,iStack_50,
                   (_typeobject **)&local_68);
      }
      else {
        *iStack_50._M_current = (_typeobject *)local_68.m_ptr;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      sVar8.ptr = sVar8.ptr + 1;
    } while ((sequence_fast_readonly)sVar8.ptr != tVar4.super_sequence_fast_readonly.ptr);
  }
  object::~object((object *)&local_60);
  piVar5 = get_internals();
  if (iStack_50._M_current != local_58) {
    uVar9 = 0;
    do {
      local_60.m_ptr = (PyObject *)local_58[uVar9];
      if ((((((_typeobject *)local_60.m_ptr)->ob_base).ob_base.ob_type)->tp_flags & 0x80000000) != 0
         ) {
        cVar6 = std::
                _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(piVar5->registered_types_py)._M_h,(key_type *)&local_60);
        if (cVar6.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          p_Var3 = (_typeobject *)local_60.m_ptr[0x15].ob_refcnt;
          if (p_Var3 != (_typeobject *)0x0) {
            if (uVar9 + 1 == (long)iStack_50._M_current - (long)local_58 >> 3) {
              iStack_50._M_current = iStack_50._M_current + -1;
              uVar9 = uVar9 - 1;
            }
            (p_Var3->ob_base).ob_base.ob_refcnt =
                 (Py_ssize_t)
                 ((long)&(((PyTypeObject *)(p_Var3->ob_base).ob_base.ob_refcnt)->ob_base).ob_base.
                         ob_refcnt + 1);
            sVar8.ptr = (PyObject **)&p_Var3->tp_name;
            if ((((p_Var3->ob_base).ob_base.ob_type)->tp_flags & 0x2000000) != 0) {
              sVar8.ptr = (PyObject **)*sVar8.ptr;
            }
            local_68.m_ptr = (PyObject *)p_Var3;
            tVar4 = tuple::end((tuple *)&local_68);
            for (; (sequence_fast_readonly)sVar8.ptr != tVar4.super_sequence_fast_readonly.ptr;
                sVar8.ptr = sVar8.ptr + 1) {
              local_38 = (_typeobject *)*sVar8.ptr;
              if (iStack_50._M_current == local_48) {
                std::vector<_typeobject*,std::allocator<_typeobject*>>::
                _M_realloc_insert<_typeobject*>
                          ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,iStack_50,
                           &local_38);
              }
              else {
                *iStack_50._M_current = local_38;
                iStack_50._M_current = iStack_50._M_current + 1;
              }
            }
            object::~object((object *)&local_68);
          }
        }
        else {
          plVar2 = *(long **)((long)cVar6.
                                    super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                    ._M_cur + 0x18);
          for (plVar10 = *(long **)((long)cVar6.
                                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                          ._M_cur + 0x10); plVar10 != plVar2; plVar10 = plVar10 + 1)
          {
            local_68.m_ptr = (PyObject *)*plVar10;
            __position._M_current =
                 (bases->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            for (pptVar7 = (bases->
                           super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                pptVar7 != __position._M_current; pptVar7 = pptVar7 + 1) {
              if ((_typeobject *)*pptVar7 == (_typeobject *)local_68.m_ptr) goto LAB_0010fd6e;
            }
            if (__position._M_current ==
                (bases->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
              ::_M_realloc_insert<pybind11::detail::type_info*const&>
                        ((vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
                          *)bases,__position,(type_info **)&local_68);
            }
            else {
              *__position._M_current = (type_info *)local_68.m_ptr;
              ppptVar1 = &(bases->
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *ppptVar1 = *ppptVar1 + 1;
            }
LAB_0010fd6e:
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)iStack_50._M_current - (long)local_58 >> 3));
  }
  if (local_58 != (_typeobject **)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE inline void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases))
        check.push_back((PyTypeObject *) parent.ptr());

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) continue;

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before: we
            // want to follow Python/virtual C++ rules that there should only be one instance of a
            // common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) { found = true; break; }
                }
                if (!found) bases.push_back(tinfo);
            }
        }
        else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases))
                check.push_back((PyTypeObject *) parent.ptr());
        }
    }
}